

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O0

uint64_t __thiscall
cppnet::CppNetBase::AddTimer
          (CppNetBase *this,uint32_t interval,user_timer_call_back *cb,void *param,bool always)

{
  uint uVar1;
  uint32_t uVar2;
  pointer this_00;
  __shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  TimerId tid;
  uint32_t id;
  uint32_t index;
  bool always_local;
  void *param_local;
  user_timer_call_back *cb_local;
  uint32_t interval_local;
  CppNetBase *this_local;
  
  this_00 = std::unique_ptr<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>::
            operator->(&this->_random);
  uVar1 = RangeRandom::Random(this_00);
  this_01 = (__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
            ::operator[](&this->_dispatchers,(ulong)uVar1);
  this_02 = std::__shared_ptr_access<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_01);
  uVar2 = Dispatcher::AddTimer(this_02,cb,param,interval,always);
  return CONCAT44(uVar1,uVar2);
}

Assistant:

uint64_t CppNetBase::AddTimer(uint32_t interval, user_timer_call_back&& cb, void* param, bool always) {
    uint32_t index = _random->Random();
    uint32_t id = _dispatchers[index]->AddTimer(cb, param, interval, always);
    TimerId tid;
    tid._detail_info._dispatcher_index = index;
    tid._detail_info._timer_id = id;
    return tid._timer_id;
}